

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDelay.c
# Opt level: O3

int If_CutDelaySop(If_Man_t *p,If_Cut_t *pCut)

{
  If_Cut_t *pIVar1;
  uint uVar2;
  float fVar3;
  uint uVar4;
  Vec_Int_t *pVVar5;
  void *pvVar6;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  int iVar9;
  int iVar10;
  uint uVar11;
  uint uVar13;
  char cVar14;
  int iVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 in_XMM13 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar39 [16];
  uint uVar41;
  uint uVar42;
  ulong uVar12;
  uint uVar38;
  uint uVar40;
  
  uVar2 = *(uint *)&pCut->field_0x1c;
  *(uint *)&pCut->field_0x1c = uVar2 | 0x2000;
  iVar10 = 0;
  if (0xffffff < uVar2) {
    pIVar1 = pCut + 1;
    uVar11 = uVar2 >> 0x18;
    uVar12 = (ulong)uVar11;
    if (uVar11 == 1) {
      fVar3 = pIVar1->Area;
      if (((long)(int)fVar3 < 0) || (p->vObjs->nSize <= (int)fVar3)) {
LAB_0041c832:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      iVar10 = (int)*(float *)((long)p->vObjs->pArray[(int)fVar3] + 0x5c);
    }
    else {
      if (pCut->iCutFunc < 0) {
        __assert_fail("pCut->iCutFunc >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/if.h"
                      ,0x1b4,"int If_CutTruthLit(If_Cut_t *)");
      }
      uVar16 = (uint)pCut->iCutFunc >> 1;
      if (p->vTtIsops[uVar12]->nSize <= (int)uVar16) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar5 = p->vTtIsops[uVar12]->pArray;
      uVar4 = pVVar5[uVar16].nSize;
      iVar10 = -1;
      if (((ulong)uVar4 != 0) && ((int)uVar4 <= p->pPars->nGateSize)) {
        if (0x10ffffff < uVar2) {
          __assert_fail("If_CutLeaveNum(pCut) >= 0 && If_CutLeaveNum(pCut) <= 16",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDelay.c"
                        ,0x56,"int If_CutDelaySop(If_Man_t *, If_Cut_t *)");
        }
        if (0 < (int)uVar4) {
          uVar17 = uVar11 - 1;
          uVar19 = 0;
          uVar18 = 0;
          do {
            iVar10 = pVVar5[uVar16].pArray[uVar19];
            uVar13 = uVar11 + 3 & 0x3c;
            uVar38 = 0;
            uVar40 = 1;
            uVar41 = 2;
            uVar42 = 3;
            uVar21 = 0;
            uVar23 = 0;
            uVar25 = 0;
            uVar27 = 0;
            do {
              uVar26 = uVar27;
              uVar24 = uVar25;
              uVar22 = uVar23;
              uVar20 = uVar21;
              uVar31 = uVar42;
              uVar30 = uVar41;
              uVar29 = uVar40;
              uVar28 = uVar38;
              auVar35._4_4_ = uVar29 * 2;
              auVar35._0_4_ = uVar28 * 2;
              iVar15 = uVar30 * 2;
              auVar35._8_4_ = iVar15;
              iVar9 = uVar31 * 2;
              auVar35._12_4_ = iVar9;
              auVar34 = pshuflw(in_XMM13,auVar35,0xfe);
              auVar35 = pshuflw(auVar34,auVar35,0x54);
              auVar32._4_4_ = iVar9;
              auVar32._0_4_ = iVar15;
              auVar32._8_4_ = iVar15;
              auVar32._12_4_ = iVar9;
              auVar36 = pshuflw(auVar35,auVar32,0xfe);
              auVar33._4_4_ = iVar10;
              auVar33._0_4_ = iVar10;
              auVar33._8_4_ = iVar10;
              auVar33._12_4_ = iVar10;
              uVar40 = iVar10 >> auVar36;
              auVar7._4_8_ = auVar33._8_8_;
              auVar7._0_4_ = uVar40;
              auVar39._0_8_ = auVar7._0_8_ << 0x20;
              auVar39._8_4_ = uVar40;
              auVar39._12_4_ = uVar40;
              auVar33 = pshuflw(auVar32,auVar32,0x54);
              auVar36._4_4_ = iVar10;
              auVar36._0_4_ = iVar10;
              auVar36._8_4_ = iVar10;
              auVar36._12_4_ = iVar10;
              uVar38 = iVar10 >> auVar33;
              auVar8._4_8_ = auVar36._8_8_;
              auVar8._0_4_ = uVar38;
              auVar37._0_8_ = auVar8._0_8_ << 0x20;
              auVar37._8_4_ = uVar38;
              auVar37._12_4_ = uVar38;
              in_XMM13._8_8_ = auVar39._8_8_;
              in_XMM13._0_8_ = auVar37._8_8_;
              uVar41 = iVar10 >> auVar35 & 3;
              uVar42 = iVar10 >> auVar34 & 3;
              uVar21 = uVar20 + (uVar41 == 1 || uVar41 == 2);
              uVar23 = uVar22 + (uVar42 == 1 || uVar42 == 2);
              uVar25 = uVar24 + ((uVar38 & 3) == 1 || (uVar38 & 3) == 2);
              uVar27 = uVar26 + ((uVar40 & 3) == 1 || (uVar40 & 3) == 2);
              uVar13 = uVar13 - 4;
              uVar38 = uVar28 + 4;
              uVar40 = uVar29 + 4;
              uVar41 = uVar30 + 4;
              uVar42 = uVar31 + 4;
            } while (uVar13 != 0);
            uVar13 = -(uint)((int)(uVar17 ^ 0x80000000) < (int)(uVar28 ^ 0x80000000));
            uVar38 = -(uint)((int)(uVar17 ^ 0x80000000) < (int)(uVar29 ^ 0x80000000));
            uVar40 = -(uint)((int)(uVar17 ^ 0x80000000) < (int)(uVar30 ^ 0x80000000));
            uVar41 = -(uint)((int)(uVar17 ^ 0x80000000) < (int)(uVar31 ^ 0x80000000));
            uVar13 = (~uVar41 & uVar27 | uVar26 & uVar41) + (~uVar38 & uVar23 | uVar22 & uVar38) +
                     (~uVar40 & uVar25 | uVar24 & uVar40) + (~uVar13 & uVar21 | uVar20 & uVar13);
            if ((int)uVar18 <= (int)uVar13) {
              uVar18 = uVar13;
            }
            uVar19 = uVar19 + 1;
          } while (uVar19 != uVar4);
          if (uVar4 != 1) {
            *(uint *)&pCut->field_0x1c = uVar2 & 0x1ffff000 | 0x2000 | uVar4 + 1 & 0xfff;
            cVar14 = (char)(int)(If_CutDelaySop::GateDelays[uVar12] +
                                 If_CutDelaySop::GateDelays[uVar18] + 0.5);
            uVar19 = 0;
            iVar10 = 0;
            while( true ) {
              fVar3 = (&pIVar1->Area)[uVar19];
              if (((long)(int)fVar3 < 0) || (p->vObjs->nSize <= (int)fVar3)) break;
              pvVar6 = p->vObjs->pArray[(int)fVar3];
              if (pvVar6 == (void *)0x0) {
                return iVar10;
              }
              fVar3 = *(float *)((long)pvVar6 + 0x5c);
              *(char *)((long)&pCut[1].Area + uVar19 + uVar12 * 4) = cVar14;
              iVar15 = (int)(fVar3 + (float)(int)cVar14);
              if (iVar10 <= iVar15) {
                iVar10 = iVar15;
              }
              uVar19 = uVar19 + 1;
              if (uVar12 == uVar19) {
                return iVar10;
              }
            }
            goto LAB_0041c832;
          }
        }
        *(uint *)&pCut->field_0x1c = uVar2 & 0x1ffff000 | 0x2000 | uVar4 & 0xfff;
        cVar14 = (char)(int)(If_CutDelaySop::GateDelays[uVar12] + 0.5);
        uVar19 = 0;
        iVar10 = 0;
        do {
          fVar3 = (&pIVar1->Area)[uVar19];
          if (((long)(int)fVar3 < 0) || (p->vObjs->nSize <= (int)fVar3)) goto LAB_0041c832;
          pvVar6 = p->vObjs->pArray[(int)fVar3];
          if (pvVar6 == (void *)0x0) {
            return iVar10;
          }
          fVar3 = *(float *)((long)pvVar6 + 0x5c);
          *(char *)((long)&pCut[1].Area + uVar19 + uVar12 * 4) = cVar14;
          iVar15 = (int)(fVar3 + (float)(int)cVar14);
          if (iVar10 <= iVar15) {
            iVar10 = iVar15;
          }
          uVar19 = uVar19 + 1;
        } while (uVar11 + (uVar11 == 0) != uVar19);
      }
    }
  }
  return iVar10;
}

Assistant:

int If_CutDelaySop( If_Man_t * p, If_Cut_t * pCut )
{
    char * pPerm = If_CutPerm( pCut );
    // delay is calculated using 1+log2(NumFanins)
    static double GateDelays[20] = { 1.00, 1.00, 2.00, 2.58, 3.00, 3.32, 3.58, 3.81, 4.00, 4.17, 4.32, 4.46, 4.58, 4.70, 4.81, 4.91, 5.00, 5.09, 5.17, 5.25 };
    Vec_Int_t * vCover;
    If_Obj_t * pLeaf;
    int i, nLitMax, Delay, DelayMax;
    // mark cut as a user cut
    pCut->fUser = 1;
    if ( pCut->nLeaves == 0 )
        return 0;
    if ( pCut->nLeaves == 1 )
        return (int)If_ObjCutBest(If_CutLeaf(p, pCut, 0))->Delay;
    vCover = Vec_WecEntry( p->vTtIsops[pCut->nLeaves], Abc_Lit2Var(If_CutTruthLit(pCut)) );
    if ( Vec_IntSize(vCover) == 0 )
        return -1;
    // mark the output as complemented
//    vAnds = If_CutDelaySopAnds( p, pCut, vCover, RetValue ^ pCut->fCompl );
    if ( Vec_IntSize(vCover) > p->pPars->nGateSize )
        return -1;
    // set the area cost
    assert( If_CutLeaveNum(pCut) >= 0 && If_CutLeaveNum(pCut) <= 16 );
    // compute the gate delay
    nLitMax = If_CutMaxCubeSize( vCover, If_CutLeaveNum(pCut) );
    if ( Vec_IntSize(vCover) < 2 )
    {
        pCut->Cost = Vec_IntSize(vCover);
        Delay = (int)(GateDelays[If_CutLeaveNum(pCut)] + 0.5);
        DelayMax = 0;
        If_CutForEachLeaf( p, pCut, pLeaf, i )
            DelayMax = Abc_MaxInt( DelayMax, If_ObjCutBest(pLeaf)->Delay + (pPerm[i] = (char)Delay) );
    }
    else
    {
        pCut->Cost = Vec_IntSize(vCover) + 1;
        Delay = (int)(GateDelays[If_CutLeaveNum(pCut)] + GateDelays[nLitMax] + 0.5);
        DelayMax = 0;
        If_CutForEachLeaf( p, pCut, pLeaf, i )
            DelayMax = Abc_MaxInt( DelayMax, If_ObjCutBest(pLeaf)->Delay + (pPerm[i] = (char)Delay) );
    }
    return DelayMax;
}